

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpe_model_trainer.cc
# Opt level: O0

Symbol * __thiscall
sentencepiece::bpe::Trainer::GetPairSymbol(Trainer *this,Symbol *left,Symbol *right)

{
  bool bVar1;
  pointer ppVar2;
  char *pcVar3;
  ostream *poVar4;
  reference puVar5;
  Trainer *this_00;
  Trainer *local_b8;
  Symbol *s;
  const_iterator cStack_a8;
  char32 c_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  UnicodeText *__range2_1;
  const_iterator cStack_88;
  char32 c;
  const_iterator __end2;
  const_iterator __begin2;
  UnicodeText *__range2;
  UnicodeText ut;
  Die local_41;
  _Node_iterator_base<std::pair<const_unsigned_long,_sentencepiece::bpe::Trainer::Symbol_*>,_false>
  local_40;
  _Node_iterator_base<std::pair<const_unsigned_long,_sentencepiece::bpe::Trainer::Symbol_*>,_false>
  local_38;
  iterator it;
  uint64 fp;
  Symbol *right_local;
  Symbol *left_local;
  Trainer *this_local;
  
  if ((((left == (Symbol *)0x0) || (right == (Symbol *)0x0)) || ((left->is_unk & 1U) != 0)) ||
     ((right->is_unk & 1U) != 0)) {
    this_local = (Trainer *)0x0;
  }
  else {
    it.
    super__Node_iterator_base<std::pair<const_unsigned_long,_sentencepiece::bpe::Trainer::Symbol_*>,_false>
    ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_sentencepiece::bpe::Trainer::Symbol_*>,_false>
               )port::FingerprintCat(left->fp,right->fp);
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_sentencepiece::bpe::Trainer::Symbol_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_sentencepiece::bpe::Trainer::Symbol_*>_>_>
         ::find(&this->symbols_cache_,(key_type *)&it);
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_sentencepiece::bpe::Trainer::Symbol_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_sentencepiece::bpe::Trainer::Symbol_*>_>_>
         ::end(&this->symbols_cache_);
    bVar1 = std::__detail::operator!=(&local_38,&local_40);
    if (bVar1) {
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_long,_sentencepiece::bpe::Trainer::Symbol_*>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_unsigned_long,_sentencepiece::bpe::Trainer::Symbol_*>,_false,_false>
                             *)&local_38);
      this_local = (Trainer *)ppVar2->second;
    }
    else {
      bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&left->chars);
      if (bVar1) {
        error::Die::Die(&local_41,true);
        pcVar3 = logging::BaseName("src/bpe_model_trainer.cc");
        poVar4 = std::operator<<((ostream *)&std::cerr,pcVar3);
        poVar4 = std::operator<<(poVar4,"(");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x40);
        poVar4 = std::operator<<(poVar4,") [");
        poVar4 = std::operator<<(poVar4,"!left->chars.empty()");
        poVar4 = std::operator<<(poVar4,"] ");
        error::Die::operator&(&local_41,poVar4);
        error::Die::~Die(&local_41);
      }
      bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&right->chars);
      ut.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
      if (bVar1) {
        error::Die::Die((Die *)((long)&ut.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 3),true)
        ;
        ut.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._2_1_ = 1;
        pcVar3 = logging::BaseName("src/bpe_model_trainer.cc");
        poVar4 = std::operator<<((ostream *)&std::cerr,pcVar3);
        poVar4 = std::operator<<(poVar4,"(");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x41);
        poVar4 = std::operator<<(poVar4,") [");
        poVar4 = std::operator<<(poVar4,"!right->chars.empty()");
        poVar4 = std::operator<<(poVar4,"] ");
        error::Die::operator&
                  ((Die *)((long)&ut.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 3),poVar4);
      }
      if ((ut.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._2_1_ & 1) != 0) {
        error::Die::~Die((Die *)((long)&ut.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2);
      __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&left->chars);
      cStack_88 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&left->chars);
      while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff78), bVar1) {
        puVar5 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end2);
        __range2_1._4_4_ = *puVar5;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2,
                   (value_type_conflict *)((long)&__range2_1 + 4));
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end2);
      }
      __end2_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&right->chars);
      cStack_a8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&right->chars);
      while (bVar1 = __gnu_cxx::operator!=(&__end2_1,&stack0xffffffffffffff58), bVar1) {
        puVar5 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end2_1);
        s._4_4_ = *puVar5;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2,
                   (value_type_conflict *)((long)&s + 4));
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end2_1);
      }
      bVar1 = TrainerInterface::IsValidSentencePiece
                        (&this->super_TrainerInterface,(UnicodeText *)&__range2);
      if (bVar1) {
        this_00 = (Trainer *)operator_new(0x70);
        Symbol::Symbol((Symbol *)this_00);
        local_b8 = this_00;
        std::
        vector<sentencepiece::bpe::Trainer::Symbol_*,_std::allocator<sentencepiece::bpe::Trainer::Symbol_*>_>
        ::push_back(&this->allocated_,(value_type *)&local_b8);
        (local_b8->super_TrainerInterface).required_chars_._M_h._M_rehash_policy._M_next_resize =
             (size_t)it.
                     super__Node_iterator_base<std::pair<const_unsigned_long,_sentencepiece::bpe::Trainer::Symbol_*>,_false>
                     ._M_cur;
        (local_b8->super_TrainerInterface)._vptr_TrainerInterface = (_func_int **)left;
        (local_b8->super_TrainerInterface).required_chars_._M_h._M_buckets = (__buckets_ptr)right;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  ((UnicodeText *)
                   &(local_b8->super_TrainerInterface).required_chars_._M_h._M_bucket_count,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2);
        port::
        InsertOrDie<std::unordered_map<unsigned_long,sentencepiece::bpe::Trainer::Symbol*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,sentencepiece::bpe::Trainer::Symbol*>>>>
                  (&this->symbols_cache_,
                   &(local_b8->super_TrainerInterface).required_chars_._M_h._M_rehash_policy.
                    _M_next_resize,(second_type *)&local_b8);
        this_local = local_b8;
      }
      else {
        this_local = (Trainer *)0x0;
      }
      s._0_4_ = 1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range2);
    }
  }
  return (Symbol *)this_local;
}

Assistant:

Trainer::Symbol *Trainer::GetPairSymbol(const Symbol *left,
                                        const Symbol *right) {
  if (left == nullptr || right == nullptr || left->is_unk || right->is_unk) {
    return nullptr;
  }

  const uint64 fp = port::FingerprintCat(left->fp, right->fp);
  const auto it = symbols_cache_.find(fp);
  if (it != symbols_cache_.end()) {
    return it->second;
  }

  CHECK(!left->chars.empty());
  CHECK(!right->chars.empty());
  string_util::UnicodeText ut;
  for (const char32 c : left->chars) ut.push_back(c);
  for (const char32 c : right->chars) ut.push_back(c);

  // Do not make an invalid piece.
  if (!IsValidSentencePiece(ut)) {
    return nullptr;
  }

  Symbol *s = new Symbol;
  allocated_.push_back(s);
  s->fp = fp;
  s->left = left;
  s->right = right;
  s->chars = ut;
  port::InsertOrDie(&symbols_cache_, s->fp, s);
  return s;
}